

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertySpecification.cpp
# Opt level: O2

void __thiscall
Rml::PropertySpecification::PropertySpecification
          (PropertySpecification *this,size_t reserve_num_properties,size_t reserve_num_shorthands)

{
  size_type local_30;
  
  ::std::
  vector<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
  ::vector(&this->properties,reserve_num_properties + 1,(allocator_type *)&local_30);
  ::std::
  vector<std::unique_ptr<Rml::ShorthandDefinition,_std::default_delete<Rml::ShorthandDefinition>_>,_std::allocator<std::unique_ptr<Rml::ShorthandDefinition,_std::default_delete<Rml::ShorthandDefinition>_>_>_>
  ::vector(&this->shorthands,reserve_num_shorthands + 1,(allocator_type *)&local_30);
  local_30 = reserve_num_properties + 1;
  ::std::make_unique<Rml::PropertyIdNameMap,unsigned_long>((unsigned_long *)&this->property_map);
  local_30 = reserve_num_shorthands + 1;
  ::std::make_unique<Rml::ShorthandIdNameMap,unsigned_long>((unsigned_long *)&this->shorthand_map);
  (this->property_ids_forcing_layout).defined_ids.super__Base_bitset<2UL>._M_w[0] = 0;
  (this->property_ids_forcing_layout).defined_ids.super__Base_bitset<2UL>._M_w[1] = 0;
  (this->property_ids_inherited).defined_ids.super__Base_bitset<2UL>._M_w[0] = 0;
  (this->property_ids_inherited).defined_ids.super__Base_bitset<2UL>._M_w[1] = 0;
  (this->property_ids).defined_ids.super__Base_bitset<2UL>._M_w[0] = 0;
  (this->property_ids).defined_ids.super__Base_bitset<2UL>._M_w[1] = 0;
  return;
}

Assistant:

PropertySpecification::PropertySpecification(size_t reserve_num_properties, size_t reserve_num_shorthands) :
	// Increment reserve numbers by one because the 'invalid' property occupies the first element
	properties(reserve_num_properties + 1), shorthands(reserve_num_shorthands + 1),
	property_map(MakeUnique<PropertyIdNameMap>(reserve_num_properties + 1)), shorthand_map(MakeUnique<ShorthandIdNameMap>(reserve_num_shorthands + 1))
{}